

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

void Cbs2_ManDeleteFanout_rec(Cbs2_Man_t *p,int iObj)

{
  int iVar1;
  int i;
  int iVar2;
  Gia_Obj_t *pObj_00;
  int iFan1;
  int iFan0;
  Gia_Obj_t *pObj;
  int iObj_local;
  Cbs2_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p->pAig,iObj);
  Cbs2_ObjDeleteFanout(p,iObj);
  iVar1 = Gia_ObjIsCi(pObj_00);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                    ,0x5fa,"void Cbs2_ManDeleteFanout_rec(Cbs2_Man_t *, int)");
    }
    iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
    i = Gia_ObjFaninId1(pObj_00,iObj);
    iVar2 = Vec_IntEntry(&p->vFanout0,iVar1);
    if (iVar2 != 0) {
      Cbs2_ManDeleteFanout_rec(p,iVar1);
    }
    iVar1 = Vec_IntEntry(&p->vFanout0,i);
    if (iVar1 != 0) {
      Cbs2_ManDeleteFanout_rec(p,i);
    }
  }
  return;
}

Assistant:

void Cbs2_ManDeleteFanout_rec( Cbs2_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pAig, iObj); int iFan0, iFan1;
    Cbs2_ObjDeleteFanout( p, iObj ); 
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    iFan0 = Gia_ObjFaninId0(pObj, iObj);
    iFan1 = Gia_ObjFaninId1(pObj, iObj);
    if ( Vec_IntEntry(&p->vFanout0, iFan0) )  Cbs2_ManDeleteFanout_rec( p, iFan0 );
    if ( Vec_IntEntry(&p->vFanout0, iFan1) )  Cbs2_ManDeleteFanout_rec( p, iFan1 );
}